

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O1

Prim * tinyusdz::tydra::GetParentPrim(Stage *stage,Path *path,string *err)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  long *plVar3;
  undefined1 in_CL;
  char *pcVar4;
  value_type pPVar5;
  size_type *psVar6;
  size_type *psVar7;
  char *pcVar8;
  Prim *pPVar9;
  expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret;
  Path parentPath;
  string local_1c0;
  undefined1 local_1a0 [16];
  undefined1 local_190 [152];
  Path local_f8;
  
  if (path->_valid == false) {
    if (err != (string *)0x0) {
      tinyusdz::to_string_abi_cxx11_(&local_1c0,(tinyusdz *)path,(Path *)0x1,(bool)in_CL);
      plVar3 = (long *)::std::__cxx11::string::replace((ulong)&local_1c0,0,(char *)0x0,0x61cae4);
      pPVar5 = (value_type)(plVar3 + 2);
      if ((value_type)*plVar3 == pPVar5) {
        local_190._0_8_ = (pPVar5->_abs_path)._prim_part._M_dataplus._M_p;
        local_190._8_8_ = plVar3[3];
        local_1a0._0_8_ = (value_type)local_190;
      }
      else {
        local_190._0_8_ = (pPVar5->_abs_path)._prim_part._M_dataplus._M_p;
        local_1a0._0_8_ = (value_type)*plVar3;
      }
      local_1a0._8_8_ = plVar3[1];
      *plVar3 = (long)pPVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)::std::__cxx11::string::append(local_1a0);
      paVar1 = &local_f8._prim_part.field_2;
      psVar6 = (size_type *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_f8._prim_part.field_2._M_allocated_capacity = *psVar6;
        local_f8._prim_part.field_2._8_8_ = plVar3[3];
        local_f8._prim_part._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_f8._prim_part.field_2._M_allocated_capacity = *psVar6;
        local_f8._prim_part._M_dataplus._M_p = (pointer)*plVar3;
      }
      local_f8._prim_part._M_string_length = plVar3[1];
      *plVar3 = (long)psVar6;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      ::std::__cxx11::string::operator=((string *)err,(string *)&local_f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._prim_part._M_dataplus._M_p != paVar1) {
        operator_delete(local_f8._prim_part._M_dataplus._M_p,
                        local_f8._prim_part.field_2._M_allocated_capacity + 1);
      }
      if ((value_type)local_1a0._0_8_ != (value_type)local_190) {
        operator_delete((void *)local_1a0._0_8_,(ulong)(local_190._0_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
        operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
      }
    }
  }
  else {
    if (((path->_prim_part)._M_string_length == 1) && (*(path->_prim_part)._M_dataplus._M_p == '/'))
    {
      if (err == (string *)0x0) {
        return (Prim *)0x0;
      }
      pcVar8 = (char *)err->_M_string_length;
      pcVar4 = "Input Path is root(\"/\").\n";
    }
    else {
      bVar2 = Path::is_root_prim(path);
      if (bVar2) {
        if (err == (string *)0x0) {
          return (Prim *)0x0;
        }
        pcVar8 = (char *)err->_M_string_length;
        pcVar4 = "Input Path is root Prim, so no parent Prim exists.\n";
      }
      else {
        if (((path->_prim_part)._M_string_length != 0) &&
           (*(path->_prim_part)._M_dataplus._M_p == '/')) {
          Path::get_parent_prim_path(&local_f8,path);
          Stage::GetPrimAtPath_abi_cxx11_
                    ((expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_1a0,stage,&local_f8);
          pPVar9 = (Prim *)local_1a0._0_8_;
          if ((bool)local_190[0x10] != true) {
            if (err != (string *)0x0) {
              tinyusdz::to_string_abi_cxx11_
                        ((string *)(local_190 + 0x38),(tinyusdz *)path,(Path *)0x1,(bool)in_CL);
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (local_190 + 0x58),"Failed to get parent Prim from Path ",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (local_190 + 0x38));
              plVar3 = (long *)::std::__cxx11::string::append((char *)(local_190 + 0x58));
              psVar6 = (size_type *)(plVar3 + 2);
              if ((size_type *)*plVar3 == psVar6) {
                local_190._40_8_ = *psVar6;
                local_190._48_8_ = plVar3[3];
                local_190._24_8_ = local_190 + 0x28;
              }
              else {
                local_190._40_8_ = *psVar6;
                local_190._24_8_ = (size_type *)*plVar3;
              }
              local_190._32_8_ = plVar3[1];
              *plVar3 = (long)psVar6;
              plVar3[1] = 0;
              *(undefined1 *)(plVar3 + 2) = 0;
              if ((bool)local_190[0x10] == true) {
                __assert_fail("! has_value()",
                              "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/expected.hpp"
                              ,0x881,
                              "error_type &nonstd::expected_lite::expected<const tinyusdz::Prim *, std::basic_string<char>>::error() & [T = const tinyusdz::Prim *, E = std::basic_string<char>]"
                             );
              }
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)local_190 + 0x78U),
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (local_190 + 0x18),
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_1a0);
              plVar3 = (long *)::std::__cxx11::string::append((char *)((long)local_190 + 0x78U));
              psVar7 = (size_type *)(plVar3 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar3 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar7) {
                local_1c0.field_2._M_allocated_capacity = *psVar7;
                local_1c0.field_2._8_8_ = plVar3[3];
                local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
              }
              else {
                local_1c0.field_2._M_allocated_capacity = *psVar7;
                local_1c0._M_dataplus._M_p = (pointer)*plVar3;
              }
              local_1c0._M_string_length = plVar3[1];
              *plVar3 = (long)psVar7;
              plVar3[1] = 0;
              *(undefined1 *)(plVar3 + 2) = 0;
              ::std::__cxx11::string::_M_append((char *)err,(ulong)local_1c0._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
                operator_delete(local_1c0._M_dataplus._M_p,
                                local_1c0.field_2._M_allocated_capacity + 1);
              }
              if (local_190._120_8_ != (long)local_190 + 0x88U) {
                operator_delete((void *)local_190._120_8_,local_190._136_8_ + 1);
              }
              if ((undefined1 *)local_190._24_8_ != local_190 + 0x28) {
                operator_delete((void *)local_190._24_8_,local_190._40_8_ + 1);
              }
              if ((undefined1 *)local_190._88_8_ != local_190 + 0x68) {
                operator_delete((void *)local_190._88_8_,local_190._104_8_ + 1);
              }
              if ((undefined1 *)local_190._56_8_ != local_190 + 0x48) {
                operator_delete((void *)local_190._56_8_,local_190._72_8_ + 1);
              }
            }
            pPVar9 = (Prim *)0x0;
          }
          if (((bool)local_190[0x10] == false) && ((Prim *)local_1a0._0_8_ != (Prim *)local_190)) {
            operator_delete((void *)local_1a0._0_8_,local_190._0_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._element._M_dataplus._M_p != &local_f8._element.field_2) {
            operator_delete(local_f8._element._M_dataplus._M_p,
                            local_f8._element.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._variant_part_str._M_dataplus._M_p != &local_f8._variant_part_str.field_2)
          {
            operator_delete(local_f8._variant_part_str._M_dataplus._M_p,
                            local_f8._variant_part_str.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._variant_selection_part._M_dataplus._M_p !=
              &local_f8._variant_selection_part.field_2) {
            operator_delete(local_f8._variant_selection_part._M_dataplus._M_p,
                            local_f8._variant_selection_part.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._variant_part._M_dataplus._M_p != &local_f8._variant_part.field_2) {
            operator_delete(local_f8._variant_part._M_dataplus._M_p,
                            local_f8._variant_part.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._prop_part._M_dataplus._M_p != &local_f8._prop_part.field_2) {
            operator_delete(local_f8._prop_part._M_dataplus._M_p,
                            local_f8._prop_part.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._prim_part._M_dataplus._M_p == &local_f8._prim_part.field_2) {
            return pPVar9;
          }
          operator_delete(local_f8._prim_part._M_dataplus._M_p,
                          local_f8._prim_part.field_2._M_allocated_capacity + 1);
          return pPVar9;
        }
        if (err == (string *)0x0) {
          return (Prim *)0x0;
        }
        pcVar8 = (char *)err->_M_string_length;
        pcVar4 = "Input Path must be absolute path(i.e. starts with \"/\").\n";
      }
    }
    ::std::__cxx11::string::_M_replace((ulong)err,0,pcVar8,(ulong)pcVar4);
  }
  return (Prim *)0x0;
}

Assistant:

const Prim *GetParentPrim(const tinyusdz::Stage &stage,
                          const tinyusdz::Path &path, std::string *err) {
  if (!path.is_valid()) {
    if (err) {
      (*err) = "Input Path " + tinyusdz::to_string(path) + " is invalid.\n";
    }
    return nullptr;
  }

  if (path.is_root_path()) {
    if (err) {
      (*err) = "Input Path is root(\"/\").\n";
    }
    return nullptr;
  }

  if (path.is_root_prim()) {
    if (err) {
      (*err) = "Input Path is root Prim, so no parent Prim exists.\n";
    }
    return nullptr;
  }

  if (!path.is_absolute_path()) {
    if (err) {
      (*err) = "Input Path must be absolute path(i.e. starts with \"/\").\n";
    }
    return nullptr;
  }

  tinyusdz::Path parentPath = path.get_parent_prim_path();

  nonstd::expected<const Prim *, std::string> ret =
      stage.GetPrimAtPath(parentPath);
  if (ret) {
    return ret.value();
  } else {
    if (err) {
      (*err) += "Failed to get parent Prim from Path " +
                tinyusdz::to_string(path) + ". Reason = " + ret.error() + "\n";
    }
    return nullptr;
  }
}